

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O2

void __thiscall
bssl::HPKETest_SetupSenderBufferTooSmall_Test::TestBody
          (HPKETest_SetupSenderBufferTooSmall_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  ulong uVar2;
  AssertHelper local_390;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_388;
  AssertionResult gtest_ar_;
  string local_370;
  size_t enc_len;
  uint8_t enc [31];
  uint8_t public_key_r [32];
  uint8_t secret_key_r [32];
  ScopedEVP_HPKE_CTX sender_ctx;
  
  X25519_keypair(public_key_r,secret_key_r);
  EVP_HPKE_CTX_zero(&sender_ctx.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  iVar1 = EVP_HPKE_CTX_setup_sender
                    (&sender_ctx.ctx_,enc,&enc_len,0x1f,kem,kdf,aead,public_key_r,0x20,
                     (uint8_t *)0x0,0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 == 0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    uVar2 = ERR_get_error();
    ErrorEquals((uint32_t)&gtest_ar_,(int)uVar2,6);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_388);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_370,(internal *)&gtest_ar_,
                 (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_EVP, 137)","false","true",
                 (char *)kdf);
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x24b,local_370._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      std::__cxx11::string::~string((string *)&local_370);
      if (local_388._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_388._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    ERR_clear_error();
  }
  else {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0)"
               ,"true","false",(char *)kdf);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x249,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
  ~StackAllocated(&sender_ctx);
  return;
}

Assistant:

TEST(HPKETest, SetupSenderBufferTooSmall) {
  uint8_t secret_key_r[X25519_PRIVATE_KEY_LEN];
  uint8_t public_key_r[X25519_PUBLIC_VALUE_LEN];
  X25519_keypair(public_key_r, secret_key_r);

  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN - 1];
  size_t enc_len;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_BUFFER_SIZE));
  ERR_clear_error();
}